

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

int max_passive_dmg(monst *mdef,monst *magr)

{
  uchar uVar1;
  byte bVar2;
  permonst *ppVar3;
  long lVar4;
  uint uVar5;
  
  ppVar3 = mdef->data;
  lVar4 = 0;
  while ((uVar1 = ppVar3->mattk[lVar4].aatyp, uVar1 != '\x0e' && (uVar1 != '\0'))) {
    lVar4 = lVar4 + 1;
    if (lVar4 == 6) {
      return 0;
    }
  }
  uVar1 = ppVar3->mattk[lVar4].adtyp;
  switch(uVar1) {
  case '\0':
    goto switchD_001ec5ef_caseD_0;
  default:
    return 0;
  case '\x02':
switchD_001ec5ef_caseD_2:
    if (((magr->mintrinsics & 1) == 0) || (uVar1 == '\0')) goto switchD_001ec5ef_caseD_0;
    if (uVar1 != '\x06') {
      return 0;
    }
    break;
  case '\x03':
switchD_001ec5ef_caseD_3:
    if (((magr->mintrinsics & 2) == 0) || (uVar1 == '\0')) goto switchD_001ec5ef_caseD_0;
    if (uVar1 != '\x06') {
      if (uVar1 != '\x02') {
        return 0;
      }
      goto switchD_001ec5ef_caseD_2;
    }
    break;
  case '\x06':
    break;
  case '\b':
    if ((magr->mintrinsics & 0x40) == 0) goto switchD_001ec5ef_caseD_0;
    switch(uVar1) {
    case '\0':
      goto switchD_001ec5ef_caseD_0;
    default:
      return 0;
    case '\x02':
      goto switchD_001ec5ef_caseD_2;
    case '\x03':
      goto switchD_001ec5ef_caseD_3;
    case '\x06':
      break;
    }
  }
  if ((magr->mintrinsics & 0x10) != 0) {
    return 0;
  }
switchD_001ec5ef_caseD_0:
  bVar2 = ppVar3->mattk[lVar4].damn;
  uVar5 = (uint)bVar2;
  if (bVar2 == 0) {
    uVar5 = (int)ppVar3->mlevel + 1;
  }
  return ppVar3->mattk[lVar4].damd * uVar5;
}

Assistant:

int max_passive_dmg(struct monst *mdef, struct monst *magr)
{
    int	i, dmg = 0;
    uchar adtyp;

    for (i = 0; i < NATTK; i++)
	if (mdef->data->mattk[i].aatyp == AT_NONE ||
		mdef->data->mattk[i].aatyp == AT_BOOM) {
	    adtyp = mdef->data->mattk[i].adtyp;
	    if ((adtyp == AD_ACID && !resists_acid(magr)) ||
		    (adtyp == AD_COLD && !resists_cold(magr)) ||
		    (adtyp == AD_FIRE && !resists_fire(magr)) ||
		    (adtyp == AD_ELEC && !resists_elec(magr)) ||
		    adtyp == AD_PHYS) {
		dmg = mdef->data->mattk[i].damn;
		if (!dmg) dmg = mdef->data->mlevel+1;
		dmg *= mdef->data->mattk[i].damd;
	    } else dmg = 0;

	    return dmg;
	}
    return 0;
}